

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::printFieldName
          (PrintExpressionContents *this,HeapType type,Index index)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false> local_c8 [3];
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false> local_b0;
  iterator it;
  TypeNames local_a0;
  undefined1 local_58 [8];
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  names;
  Index index_local;
  PrintExpressionContents *this_local;
  HeapType type_local;
  
  it.super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false>)type.id;
  names._M_h._M_single_bucket._4_4_ = index;
  PrintSExpression::TypePrinter::getNames(&local_a0,&this->parent->typePrinter,type);
  std::
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  ::unordered_map((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                   *)local_58,&local_a0.fieldNames);
  TypeNames::~TypeNames(&local_a0);
  local_b0._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
       ::find((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
               *)local_58,(key_type *)((long)&names._M_h._M_single_bucket + 4));
  local_c8[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
       ::end((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
              *)local_58);
  bVar1 = std::__detail::operator!=(&local_b0,local_c8);
  if (bVar1) {
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false> *
                          )&local_b0);
    wasm::Name::print(&ppVar2->second,this->o);
  }
  else {
    std::ostream::operator<<(this->o,names._M_h._M_single_bucket._4_4_);
  }
  std::
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                    *)local_58);
  return;
}

Assistant:

void printFieldName(HeapType type, Index index) {
    auto names = parent.typePrinter.getNames(type).fieldNames;
    if (auto it = names.find(index); it != names.end()) {
      it->second.print(o);
    } else {
      o << index;
    }
  }